

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::GenerateUniqueFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,char *extension)

{
  int iVar1;
  int number;
  stat local_d0;
  char *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(__return_storage_ptr__->pathname_).field_2;
  (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)local_38;
  (__return_storage_ptr__->pathname_)._M_string_length = 0;
  (__return_storage_ptr__->pathname_).field_2._M_local_buf[0] = '\0';
  number = 0;
  local_40 = extension;
  do {
    MakeFileName((FilePath *)&local_d0,directory,base_name,number,local_40);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    if ((__nlink_t *)local_d0.st_dev != &local_d0.st_nlink) {
      operator_delete((void *)local_d0.st_dev,local_d0.st_nlink + 1);
    }
    memset(&local_d0,0,0x90);
    iVar1 = stat((__return_storage_ptr__->pathname_)._M_dataplus._M_p,&local_d0);
    number = number + 1;
  } while (iVar1 == 0);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::GenerateUniqueFileName(const FilePath& directory,
                                          const FilePath& base_name,
                                          const char* extension) {
  FilePath full_pathname;
  int number = 0;
  do {
    full_pathname.Set(MakeFileName(directory, base_name, number++, extension));
  } while (full_pathname.FileOrDirectoryExists());
  return full_pathname;
}